

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O1

RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *
capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise
          (RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>
           *__return_storage_ptr__,
          Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
          *promise)

{
  PromiseNode *pPVar1;
  Tuple<kj::Promise<Response<GetCapResults>_>,_kj::Promise<kj::Own<PipelineHook>_>_> splitPromise;
  PropagateException local_51;
  SplitTuplePromise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
  local_50;
  Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
  local_30;
  Own<kj::_::PromiseNode> local_20;
  
  kj::
  heap<kj::_::TransformPromiseNode<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>,kj::Own<capnp::PipelineHook>>,capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>,capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise(kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>&&)::_lambda(capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise(kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>&&)::_lambda(capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>&&)_1_,kj::_::PropagateException>
            (&local_20,(anon_class_1_0_00000001_for_func *)promise,&local_51);
  local_30.super_PromiseBase.node.disposer = local_20.disposer;
  local_30.super_PromiseBase.node.ptr = local_20.ptr;
  kj::
  Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
  ::split(&local_50,&local_30);
  pPVar1 = local_30.super_PromiseBase.node.ptr;
  if ((PipelineHook *)local_30.super_PromiseBase.node.ptr != (PipelineHook *)0x0) {
    local_30.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_30.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_30.super_PromiseBase.node.disposer,
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  newLocalPromisePipeline
            ((capnp *)&local_20,
             &local_50.impl.super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.
              value);
  pPVar1 = local_50.impl.super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.value.
           super_PromiseBase.node.ptr;
  (__return_storage_ptr__->
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>).
  super_PromiseBase.node.disposer =
       local_50.impl.
       super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
       .value.super_PromiseBase.node.disposer;
  (__return_storage_ptr__->
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>).
  super_PromiseBase.node.ptr =
       local_50.impl.
       super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
       .value.super_PromiseBase.node.ptr;
  (__return_storage_ptr__->super_Pipeline)._typeless.hook.disposer = local_20.disposer;
  (__return_storage_ptr__->super_Pipeline)._typeless.hook.ptr = (PipelineHook *)local_20.ptr;
  (__return_storage_ptr__->super_Pipeline)._typeless.ops.ptr = (PipelineOp *)0x0;
  (__return_storage_ptr__->super_Pipeline)._typeless.ops.size_ = 0;
  (__return_storage_ptr__->super_Pipeline)._typeless.ops.disposer = (ArrayDisposer *)0x0;
  local_20.ptr = (PromiseNode *)0x0;
  local_50.impl.
  super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
  .value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  if (local_50.impl.super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.value.
      super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_50.impl.super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.value.
    super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_50.impl.super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.value.
        super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_50.impl.super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.
               value.super_PromiseBase.node.disposer,
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  pPVar1 = local_50.impl.
           super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
           .value.super_PromiseBase.node.ptr;
  if (local_50.impl.
      super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
      .value.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_50.impl.
    super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
    .value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_50.impl.
        super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
        .value.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_50.impl.
               super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
               .value.super_PromiseBase.node.disposer,
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  return __return_storage_ptr__;
}

Assistant:

RemotePromise<T> RemotePromise<T>::reducePromise(kj::Promise<RemotePromise>&& promise) {
  kj::Tuple<kj::Promise<Response<T>>, kj::Promise<kj::Own<PipelineHook>>> splitPromise =
      promise.then([](RemotePromise&& inner) {
    // `inner` is multiply-inherited, and we want to move away each superclass separately.
    // Let's create two references to make clear what we're doing (though this is not strictly
    // necessary).
    kj::Promise<Response<T>>& innerPromise = inner;
    typename T::Pipeline& innerPipeline = inner;
    return kj::tuple(kj::mv(innerPromise), PipelineHook::from(kj::mv(innerPipeline)));
  }).split();

  return RemotePromise(kj::mv(kj::get<0>(splitPromise)),
      typename T::Pipeline(AnyPointer::Pipeline(
          newLocalPromisePipeline(kj::mv(kj::get<1>(splitPromise))))));
}